

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O0

unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
createColorPrimaries(khr_df_primaries_e primaries)

{
  unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *this;
  int in_ESI;
  _Head_base<0UL,_const_ColorPrimaries_*,_false> in_RDI;
  _Head_base<0UL,_const_ColorPrimaries_*,_false> _Var1;
  
  this = (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
         (ulong)(in_ESI - 1);
  _Var1._M_head_impl = in_RDI._M_head_impl;
  switch(this) {
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x0:
    std::make_unique<ColorPrimariesBT709>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesBT709,std::default_delete<ColorPrimariesBT709>,void>
              (this,(unique_ptr<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_> *)
                    _Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_> *)
               in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x1:
    std::make_unique<ColorPrimariesBT601_625_EBU>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesBT601_625_EBU,std::default_delete<ColorPrimariesBT601_625_EBU>,void>
              (this,(unique_ptr<ColorPrimariesBT601_625_EBU,_std::default_delete<ColorPrimariesBT601_625_EBU>_>
                     *)_Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesBT601_625_EBU,_std::default_delete<ColorPrimariesBT601_625_EBU>_>
    ::~unique_ptr((unique_ptr<ColorPrimariesBT601_625_EBU,_std::default_delete<ColorPrimariesBT601_625_EBU>_>
                   *)in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x2:
    std::make_unique<ColorPrimariesBT601_525_SMPTE>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesBT601_525_SMPTE,std::default_delete<ColorPrimariesBT601_525_SMPTE>,void>
              (this,(unique_ptr<ColorPrimariesBT601_525_SMPTE,_std::default_delete<ColorPrimariesBT601_525_SMPTE>_>
                     *)_Var1._M_head_impl);
    std::
    unique_ptr<ColorPrimariesBT601_525_SMPTE,_std::default_delete<ColorPrimariesBT601_525_SMPTE>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesBT601_525_SMPTE,_std::default_delete<ColorPrimariesBT601_525_SMPTE>_>
                 *)in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x3:
    std::make_unique<ColorPrimariesBT2020>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesBT2020,std::default_delete<ColorPrimariesBT2020>,void>
              (this,(unique_ptr<ColorPrimariesBT2020,_std::default_delete<ColorPrimariesBT2020>_> *)
                    _Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesBT2020,_std::default_delete<ColorPrimariesBT2020>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesBT2020,_std::default_delete<ColorPrimariesBT2020>_> *)
               in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x4:
    std::make_unique<ColorPrimariesCIEXYZ>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesCIEXYZ,std::default_delete<ColorPrimariesCIEXYZ>,void>
              (this,(unique_ptr<ColorPrimariesCIEXYZ,_std::default_delete<ColorPrimariesCIEXYZ>_> *)
                    _Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesCIEXYZ,_std::default_delete<ColorPrimariesCIEXYZ>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesCIEXYZ,_std::default_delete<ColorPrimariesCIEXYZ>_> *)
               in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x5:
    std::make_unique<ColorPrimariesACES>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesACES,std::default_delete<ColorPrimariesACES>,void>
              (this,(unique_ptr<ColorPrimariesACES,_std::default_delete<ColorPrimariesACES>_> *)
                    _Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesACES,_std::default_delete<ColorPrimariesACES>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesACES,_std::default_delete<ColorPrimariesACES>_> *)
               in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x6:
    std::make_unique<ColorPrimariesACEScc>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesACEScc,std::default_delete<ColorPrimariesACEScc>,void>
              (this,(unique_ptr<ColorPrimariesACEScc,_std::default_delete<ColorPrimariesACEScc>_> *)
                    _Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesACEScc,_std::default_delete<ColorPrimariesACEScc>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesACEScc,_std::default_delete<ColorPrimariesACEScc>_> *)
               in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x7:
    std::make_unique<ColorPrimariesNTSC1953>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesNTSC1953,std::default_delete<ColorPrimariesNTSC1953>,void>
              (this,(unique_ptr<ColorPrimariesNTSC1953,_std::default_delete<ColorPrimariesNTSC1953>_>
                     *)_Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesNTSC1953,_std::default_delete<ColorPrimariesNTSC1953>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesNTSC1953,_std::default_delete<ColorPrimariesNTSC1953>_> *)
                in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x8:
    std::make_unique<ColorPrimariesPAL525>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesPAL525,std::default_delete<ColorPrimariesPAL525>,void>
              (this,(unique_ptr<ColorPrimariesPAL525,_std::default_delete<ColorPrimariesPAL525>_> *)
                    _Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesPAL525,_std::default_delete<ColorPrimariesPAL525>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesPAL525,_std::default_delete<ColorPrimariesPAL525>_> *)
               in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0x9:
    std::make_unique<ColorPrimariesDisplayP3>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesDisplayP3,std::default_delete<ColorPrimariesDisplayP3>,void>
              (this,(unique_ptr<ColorPrimariesDisplayP3,_std::default_delete<ColorPrimariesDisplayP3>_>
                     *)_Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesDisplayP3,_std::default_delete<ColorPrimariesDisplayP3>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesDisplayP3,_std::default_delete<ColorPrimariesDisplayP3>_>
                 *)in_RDI._M_head_impl);
    break;
  case (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)0xa:
    std::make_unique<ColorPrimariesAdobeRGB>();
    std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
    unique_ptr<ColorPrimariesAdobeRGB,std::default_delete<ColorPrimariesAdobeRGB>,void>
              (this,(unique_ptr<ColorPrimariesAdobeRGB,_std::default_delete<ColorPrimariesAdobeRGB>_>
                     *)_Var1._M_head_impl);
    std::unique_ptr<ColorPrimariesAdobeRGB,_std::default_delete<ColorPrimariesAdobeRGB>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesAdobeRGB,_std::default_delete<ColorPrimariesAdobeRGB>_> *)
                in_RDI._M_head_impl);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                  ,0x5ac,
                  "std::unique_ptr<const ColorPrimaries> createColorPrimaries(khr_df_primaries_e)");
  }
  return (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
          )(tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
           _Var1._M_head_impl;
}

Assistant:

static std::unique_ptr<const ColorPrimaries>
createColorPrimaries(khr_df_primaries_e primaries) {
    switch (primaries) {
    case KHR_DF_PRIMARIES_BT709:
        return std::make_unique<ColorPrimariesBT709>();
    case KHR_DF_PRIMARIES_BT601_EBU:
        return std::make_unique<ColorPrimariesBT601_625_EBU>();
    case KHR_DF_PRIMARIES_BT601_SMPTE:
        return std::make_unique<ColorPrimariesBT601_525_SMPTE>();
    case KHR_DF_PRIMARIES_BT2020:
        return std::make_unique<ColorPrimariesBT2020>();
    case KHR_DF_PRIMARIES_CIEXYZ:
        return std::make_unique<ColorPrimariesCIEXYZ>();
    case KHR_DF_PRIMARIES_ACES:
        return std::make_unique<ColorPrimariesACES>();
    case KHR_DF_PRIMARIES_ACESCC:
        return std::make_unique<ColorPrimariesACEScc>();
    case KHR_DF_PRIMARIES_NTSC1953:
        return std::make_unique<ColorPrimariesNTSC1953>();
    case KHR_DF_PRIMARIES_PAL525:
        return std::make_unique<ColorPrimariesPAL525>();
    case KHR_DF_PRIMARIES_DISPLAYP3:
        return std::make_unique<ColorPrimariesDisplayP3>();
    case KHR_DF_PRIMARIES_ADOBERGB:
        return std::make_unique<ColorPrimariesAdobeRGB>();
    default:
        assert(false);
        // We return BT709 by default if some error happened
        return std::make_unique<ColorPrimariesBT709>();
    }
}